

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stonemask.cc
# Opt level: O0

void sptk::world::StoneMask
               (double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               double *refined_f0)

{
  int in_R9D;
  double dVar1;
  int i;
  int local_28;
  
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    dVar1 = anon_unknown_1::GetRefinedF0
                      ((double *)CONCAT44(x_length,fs),temporal_positions._4_4_,
                       (int)temporal_positions,(double)f0,(double)CONCAT44(f0_length,i));
    f0[local_28] = dVar1;
  }
  return;
}

Assistant:

void StoneMask(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    double *refined_f0) {
  for (int i = 0; i < f0_length; i++)
    refined_f0[i] =
      GetRefinedF0(x, x_length, fs, temporal_positions[i], f0[i]);
}